

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_allocate_medium(t_heap<xemmai::t_object> *this,size_t a_size)

{
  long *plVar1;
  t_object *ptVar2;
  
  if (a_size < 0x101) {
    plVar1 = (long *)__tls_get_addr(&PTR_0010ffd8);
    ptVar2 = (t_object *)*plVar1;
    if (ptVar2 == (t_object *)0x0) {
      ptVar2 = t_of<1UL,_16384UL>::f_allocate((t_of<1UL,_16384UL> *)(this + 0x88),this);
    }
  }
  else if (a_size < 0x201) {
    plVar1 = (long *)__tls_get_addr(&PTR_0010ff58);
    ptVar2 = (t_object *)*plVar1;
    if (ptVar2 == (t_object *)0x0) {
      ptVar2 = t_of<2UL,_4096UL>::f_allocate((t_of<2UL,_4096UL> *)(this + 0xb0),this);
    }
  }
  else if (a_size < 0x401) {
    plVar1 = (long *)__tls_get_addr(&PTR_0010fd80);
    ptVar2 = (t_object *)*plVar1;
    if (ptVar2 == (t_object *)0x0) {
      ptVar2 = t_of<3UL,_1024UL>::f_allocate((t_of<3UL,_1024UL> *)(this + 0xd8),this);
    }
  }
  else {
    if (0x800 < a_size) {
      ptVar2 = f_allocate_large(this,a_size);
      return ptVar2;
    }
    plVar1 = (long *)__tls_get_addr(&PTR_0010ffe8);
    ptVar2 = (t_object *)*plVar1;
    if (ptVar2 == (t_object *)0x0) {
      ptVar2 = t_of<4UL,_256UL>::f_allocate((t_of<4UL,_256UL> *)(this + 0x100),this);
    }
  }
  *plVar1 = (long)ptVar2->v_next;
  return ptVar2;
}

Assistant:

constexpr T* t_heap<T>::f_allocate_medium(size_t a_size)
{
	if (a_size <= c_UNIT << 1) return f_allocate(v_of1);
	if (a_size <= c_UNIT << 2) return f_allocate(v_of2);
	if (a_size <= c_UNIT << 3) return f_allocate(v_of3);
	if (a_size <= c_UNIT << 4) return f_allocate(v_of4);
	return f_allocate_large(a_size);
}